

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O3

void Dau_DecVarReplace(char *pStr,int *pPerm,int nVars)

{
  byte bVar1;
  char *pcVar3;
  char cVar2;
  
  cVar2 = *pStr;
  if (cVar2 != '\0') {
    pcVar3 = pStr + 1;
    do {
      bVar1 = cVar2 + 0x9f;
      if (bVar1 < 0x1a) {
        if (nVars <= (int)(uint)bVar1) {
          __assert_fail("pStr[v] - \'a\' < nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNonDsd.c"
                        ,0x233,"void Dau_DecVarReplace(char *, int *, int)");
        }
        pcVar3[-1] = (char)pPerm[bVar1] + 'a';
      }
      cVar2 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar2 != '\0');
  }
  return;
}

Assistant:

void Dau_DecVarReplace( char * pStr, int * pPerm, int nVars )
{
    int v;
    for ( v = 0; pStr[v]; v++ )
        if ( pStr[v] >= 'a' && pStr[v] <= 'z' )
        {
            assert( pStr[v] - 'a' < nVars );
            pStr[v] = 'a' + pPerm[pStr[v] - 'a'];
        }
}